

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

bool __thiscall
re2::RE2::DoMatch(RE2 *this,StringPiece *text,Anchor anchor,int *consumed,Arg **args,int n)

{
  Arg **ppAVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  LogMessage *submatch;
  LogMessage *pLVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  StringPiece stkvec [17];
  Arg **local_1c0;
  LogMessage local_1b8;
  
  if (this->error_code_ != NoError) {
    if ((this->options_).log_errors_ != true) {
      return false;
    }
    LogMessage::LogMessage
              (&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x326,2
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8.str_,"Invalid RE2: ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8.str_,(this->error_->_M_dataplus)._M_p,
               this->error_->_M_string_length);
    LogMessage::~LogMessage(&local_1b8);
    return false;
  }
  lVar6 = 8;
  do {
    *(undefined8 *)((long)&local_1c0 + lVar6) = 0;
    *(undefined4 *)((long)&local_1b8.severity_ + lVar6) = 0;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x118);
  uVar7 = (ulong)(n + 1U);
  if (n == 0) {
    uVar7 = (ulong)(uint)n;
  }
  if (consumed != (int *)0x0) {
    uVar7 = (ulong)(n + 1U);
  }
  iVar4 = (int)uVar7;
  local_1c0 = args;
  if (iVar4 < 0x12) {
    bVar2 = Match(this,text,0,text->length_,anchor,(StringPiece *)&local_1b8,iVar4);
    if (!bVar2) {
      return false;
    }
    submatch = (LogMessage *)0x0;
    pLVar5 = &local_1b8;
  }
  else {
    submatch = (LogMessage *)operator_new__(uVar7 * 0x10);
    pLVar5 = submatch;
    do {
      *(char **)&pLVar5->severity_ = (char *)0x0;
      *(int *)&pLVar5->str_ = 0;
      pLVar5 = (LogMessage *)&pLVar5->field_0x10;
    } while (pLVar5 != (LogMessage *)((long)&submatch->severity_ + uVar7 * 2 * 8));
    bVar2 = Match(this,text,0,text->length_,anchor,(StringPiece *)submatch,iVar4);
    pLVar5 = submatch;
    if (!bVar2) goto LAB_00130e2b;
  }
  ppAVar1 = local_1c0;
  if (consumed != (int *)0x0) {
    *consumed = (pLVar5->severity_ + *(int *)&pLVar5->str_) - *(int *)&text->ptr_;
  }
  if (local_1c0 == (Arg **)0x0 || n == 0) {
joined_r0x00130e10:
    if (submatch != (LogMessage *)0x0) {
      operator_delete__(submatch);
      return true;
    }
    return true;
  }
  iVar4 = NumberOfCapturingGroups(this);
  if (n <= iVar4) {
    uVar8 = 0;
    uVar7 = (ulong)(uint)n;
    if (n < 1) {
      uVar7 = uVar8;
    }
    do {
      if (uVar7 * 8 == uVar8) goto joined_r0x00130e10;
      cVar3 = (*(code *)(*(undefined8 **)((long)ppAVar1 + uVar8))[1])
                        (*(undefined8 *)(&pLVar5->field_0x10 + uVar8 * 2),
                         *(undefined4 *)(&pLVar5->field_0x10 + uVar8 * 2 + 8),
                         **(undefined8 **)((long)ppAVar1 + uVar8));
      uVar8 = uVar8 + 8;
    } while (cVar3 != '\0');
  }
  if (submatch == (LogMessage *)0x0) {
    return false;
  }
LAB_00130e2b:
  operator_delete__(submatch);
  return false;
}

Assistant:

bool RE2::DoMatch(const StringPiece& text,
                  Anchor anchor,
                  int* consumed,
                  const Arg* const* args,
                  int n) const {
  if (!ok()) {
    if (options_.log_errors())
      LOG(ERROR) << "Invalid RE2: " << *error_;
    return false;
  }

  // Count number of capture groups needed.
  int nvec;
  if (n == 0 && consumed == NULL)
    nvec = 0;
  else
    nvec = n+1;

  StringPiece* vec;
  StringPiece stkvec[kVecSize];
  StringPiece* heapvec = NULL;

  if (nvec <= arraysize(stkvec)) {
    vec = stkvec;
  } else {
    vec = new StringPiece[nvec];
    heapvec = vec;
  }

  if (!Match(text, 0, text.size(), anchor, vec, nvec)) {
    delete[] heapvec;
    return false;
  }

  if (consumed != NULL)
    *consumed = static_cast<int>(vec[0].end() - text.begin());

  if (n == 0 || args == NULL) {
    // We are not interested in results
    delete[] heapvec;
    return true;
  }

  int ncap = NumberOfCapturingGroups();
  if (ncap < n) {
    // RE has fewer capturing groups than number of arg pointers passed in
    VLOG(1) << "Asked for " << n << " but only have " << ncap;
    delete[] heapvec;
    return false;
  }

  // If we got here, we must have matched the whole pattern.
  for (int i = 0; i < n; i++) {
    const StringPiece& s = vec[i+1];
    if (!args[i]->Parse(s.data(), s.size())) {
      // TODO: Should we indicate what the error was?
      VLOG(1) << "Parse error on #" << i << " " << s << " "
              << (void*)s.data() << "/" << s.size();
      delete[] heapvec;
      return false;
    }
  }

  delete[] heapvec;
  return true;
}